

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::JsonReporter::sectionStarting(JsonReporter *this,SectionInfo *sectionInfo)

{
  JsonObjectWriter *pJVar1;
  size_t __n;
  _Elt_pointer pJVar2;
  StringRef key;
  JsonValueWriter JStack_1b8;
  
  pJVar1 = startObject(this);
  __n = 4;
  JsonObjectWriter::write((JsonObjectWriter *)&JStack_1b8,(int)pJVar1,"kind",4);
  JsonValueWriter::write(&JStack_1b8,0x16ca13,(void *)0x7,__n);
  std::__cxx11::stringstream::~stringstream((stringstream *)&JStack_1b8.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&JStack_1b8,(int)pJVar1,"name",4);
  JsonValueWriter::write<std::__cxx11::string>(&JStack_1b8,&sectionInfo->name);
  std::__cxx11::stringstream::~stringstream((stringstream *)&JStack_1b8.m_sstream);
  pJVar2 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar2 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar2 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  anon_unknown_26::writeSourceInfo(pJVar2 + -1,&sectionInfo->lineInfo);
  key.m_size = 4;
  key.m_start = "path";
  startArray(this,key);
  return;
}

Assistant:

void JsonReporter::sectionStarting( SectionInfo const& sectionInfo ) {
        assert( isInside( Writer::Array ) &&
                "Section should always start inside an object" );
        // We want to nest top level sections, even though it shares name
        // and source loc with the TEST_CASE
        auto& sectionObject = startObject();
        sectionObject.write( "kind"_sr ).write( "section"_sr );
        sectionObject.write( "name"_sr ).write( sectionInfo.name );
        writeSourceInfo( m_objectWriters.top(), sectionInfo.lineInfo );


        // TBD: Do we want to create this event lazily? It would become
        //      rather complex, but we could do it, and it would look
        //      better for empty sections. OTOH, empty sections should
        //      be rare.
        startArray( "path"_sr );
    }